

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O3

pair<char_*,_char_*> __thiscall
tcmalloc::anon_unknown_0::ChunkedStorageWriter::RecycleBuffer
          (ChunkedStorageWriter *this,char *buf_begin,char *buf_end,int want_at_least)

{
  int iVar1;
  ChunkedStorage *pCVar2;
  Chunk *pCVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  pair<char_*,_char_*> pVar7;
  
  pCVar2 = this->storage_;
  if (pCVar2->last_chunk != (Chunk *)0x0) {
    pCVar2->last_chunk->used = (int)buf_end - (int)buf_begin;
  }
  if (want_at_least == 0) {
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  else {
    iVar1 = *(int *)(pCVar2->config + 0x10);
    iVar5 = want_at_least + 0x18;
    if (want_at_least + 0x18 <= iVar1) {
      iVar5 = iVar1;
    }
    pCVar3 = (Chunk *)(**(code **)pCVar2->config)((long)iVar5);
    pCVar3->size = iVar5 + -0x17;
    pCVar3->used = 0;
    pCVar3->next = pCVar2->last_chunk;
    pCVar2->last_chunk = pCVar3;
    pcVar6 = pCVar3->data + (iVar5 + -0x17);
    pcVar4 = pCVar3->data;
  }
  pVar7.second = pcVar6;
  pVar7.first = pcVar4;
  return pVar7;
}

Assistant:

std::pair<char*, char*> RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) override {
    if (storage_->last_chunk != nullptr) {
      storage_->CloseChunk(buf_end - buf_begin);
    }
    if (want_at_least == 0) {
      return {nullptr, 0};
    }
    auto* chunk = storage_->AppendChunk(want_at_least);
    return {chunk->data, chunk->data + chunk->size};
  }